

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::ResolveTags(LWOImporter *this)

{
  pointer pSVar1;
  char *__s1;
  _Alloc_hider __s2;
  size_type sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  pointer pbVar6;
  ulong uVar7;
  ulong uVar8;
  value_type_conflict1 local_34;
  
  local_34 = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this->mMapping,
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_34);
  pbVar6 = (this->mTags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((this->mTags->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    uVar7 = 0;
    do {
      pSVar1 = (this->mSurfaces->
               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(this->mSurfaces->
                    super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
      if (lVar4 != 0) {
        uVar5 = (lVar4 >> 3) * -0x7063e7063e7063e7;
        sVar2 = pbVar6[uVar7]._M_string_length;
        uVar8 = 0;
        do {
          if ((int)pSVar1[uVar8].mName._M_string_length == (int)sVar2) {
            __s1 = pbVar6[uVar7]._M_dataplus._M_p;
            if (__s1 == (char *)0x0) {
              __assert_fail("__null != s1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                            ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            __s2._M_p = pSVar1[uVar8].mName._M_dataplus._M_p;
            if (__s2._M_p == (char *)0x0) {
              __assert_fail("__null != s2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                            ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            iVar3 = strcasecmp(__s1,__s2._M_p);
            if (iVar3 == 0) {
              (this->mMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar7] = (uint)uVar8;
              break;
            }
          }
          uVar8 = (ulong)((uint)uVar8 + 1);
        } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pbVar6 = (this->mTags->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->mTags->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
  }
  return;
}

Assistant:

void LWOImporter::ResolveTags()
{
    // --- this function is used for both LWO2 and LWOB
    mMapping->resize(mTags->size(), UINT_MAX);
    for (unsigned int a = 0; a  < mTags->size();++a)    {

        const std::string& c = (*mTags)[a];
        for (unsigned int i = 0; i < mSurfaces->size();++i) {

            const std::string& d = (*mSurfaces)[i].mName;
            if (!ASSIMP_stricmp(c,d))   {

                (*mMapping)[a] = i;
                break;
            }
        }
    }
}